

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

int get_next_job(TileDataEnc *tile_data,int *current_mi_row,int mib_size)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  bool bVar4;
  
  iVar3 = (tile_data->row_mt_sync).next_mi_row;
  bVar4 = iVar3 < (tile_data->tile_info).mi_row_end;
  if (bVar4) {
    *current_mi_row = iVar3;
    uVar1 = (tile_data->row_mt_sync).next_mi_row;
    uVar2 = (tile_data->row_mt_sync).num_threads_working;
    (tile_data->row_mt_sync).next_mi_row = mib_size + uVar1;
    (tile_data->row_mt_sync).num_threads_working = uVar2 + 1;
  }
  return (uint)bVar4;
}

Assistant:

static inline int get_next_job(TileDataEnc *const tile_data,
                               int *current_mi_row, int mib_size) {
  AV1EncRowMultiThreadSync *const row_mt_sync = &tile_data->row_mt_sync;
  const int mi_row_end = tile_data->tile_info.mi_row_end;

  if (row_mt_sync->next_mi_row < mi_row_end) {
    *current_mi_row = row_mt_sync->next_mi_row;
    row_mt_sync->num_threads_working++;
    row_mt_sync->next_mi_row += mib_size;
    return 1;
  }
  return 0;
}